

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.hpp
# Opt level: O3

void __thiscall duckdb::CSVReaderOptions::~CSVReaderOptions(CSVReaderOptions *this)

{
  pointer pcVar1;
  
  std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_bool>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_bool>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::~_Rb_tree(&(this->has_format)._M_t);
  std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::~_Rb_tree(&(this->write_date_format)._M_t);
  pcVar1 = (this->write_newline)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->write_newline).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->suffix)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->suffix).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->prefix)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->prefix).field_2) {
    operator_delete(pcVar1);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)&this->force_quote);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->user_defined_parameters)._M_t);
  pcVar1 = (this->encoding)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->encoding).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->decimal_separator)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->decimal_separator).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->file_path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->file_path).field_2) {
    operator_delete(pcVar1);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)&this->force_not_null);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->force_not_null_names)._M_h);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)&this->was_type_manually_set);
  pcVar1 = (this->sniffer_user_mismatch_error)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->sniffer_user_mismatch_error).field_2) {
    operator_delete(pcVar1);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&(this->auto_type_candidates).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->name_list);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&(this->sql_type_list).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->sql_types_per_column)._M_h);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->null_str);
  pcVar1 = (this->rejects_scan_name).value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->rejects_scan_name).value.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->rejects_table_name).value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->rejects_table_name).value.field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::~_Rb_tree(&(this->dialect_options).date_format._M_t);
  pcVar1 = (this->dialect_options).state_machine_options.delimiter.value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->dialect_options).state_machine_options.delimiter.value.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

CSVReaderOptions() {
	}